

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
          (QGraphicsSceneDragDropEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *pQVar1;
  
  pQVar1 = (QGraphicsSceneEventPrivate *)operator_new(0x70);
  pQVar1->widget = (QWidget *)0x0;
  pQVar1->q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1->timestamp = 0;
  pQVar1->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_00813fb0
  ;
  pQVar1[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[1].widget = (QWidget *)0x0;
  pQVar1[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  pQVar1[1].timestamp = 0;
  pQVar1[2]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[2].widget = (QWidget *)0x0;
  *(undefined4 *)&pQVar1[2].q_ptr = 0;
  pQVar1[3]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  pQVar1[3].widget = (QWidget *)0x0;
  QEvent::QEvent((QEvent *)this,type);
  (this->super_QGraphicsSceneEvent).d_ptr.d = pQVar1;
  pQVar1->q_ptr = &this->super_QGraphicsSceneEvent;
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_00813d00;
  return;
}

Assistant:

QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneDragDropEventPrivate, type)
{
}